

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::EnumStatement(SQCompiler *this)

{
  long *in_RDI;
  SQObject SVar1;
  SQObjectPtr strongid;
  SQTable *enums;
  SQObject val;
  SQObject key;
  SQInteger nval;
  SQObject table;
  SQObject id;
  SQCompiler *in_stack_ffffffffffffff10;
  SQCompiler *this_00;
  SQObjectPtr local_d8;
  SQObjectPtr *in_stack_ffffffffffffff38;
  SQObjectValue in_stack_ffffffffffffff40;
  SQFuncState *in_stack_ffffffffffffff48;
  SQObjectPtr local_90;
  SQObjectPtr local_80;
  SQObjectType local_70;
  undefined4 uStack_6c;
  SQObjectValue local_68;
  SQObject local_60;
  SQObjectType in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  SQObjectValue in_stack_ffffffffffffffb8;
  SQTable *local_40;
  SQObject local_38;
  SQObjectType local_28;
  SQObjectValue local_20;
  SQObject local_18;
  
  Lex(in_stack_ffffffffffffff10);
  SVar1 = Expect((SQCompiler *)in_stack_ffffffffffffffb8.pTable,
                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  local_18._unVal = SVar1._unVal;
  local_18._type = SVar1._type;
  SVar1 = Expect((SQCompiler *)in_stack_ffffffffffffffb8.pTable,
                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  local_20 = SVar1._unVal;
  local_28 = SVar1._type;
  SVar1 = SQFuncState::CreateTable(in_stack_ffffffffffffff48);
  local_38._unVal = SVar1._unVal;
  local_38._type = SVar1._type;
  local_40 = (SQTable *)0x0;
  while (*in_RDI != 0x7d) {
    SVar1 = Expect((SQCompiler *)in_stack_ffffffffffffffb8.pTable,
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    in_stack_ffffffffffffffb8 = SVar1._unVal;
    in_stack_ffffffffffffffb0 = SVar1._type;
    if (*in_RDI == 0x3d) {
      Lex(in_stack_ffffffffffffff10);
      SVar1 = ExpectScalar((SQCompiler *)in_stack_ffffffffffffff40.pTable);
      local_68 = SVar1._unVal;
      local_70 = SVar1._type;
      local_60._4_4_ = uStack_6c;
      local_60._type = local_70;
      local_60._unVal.nInteger = local_68.nInteger;
    }
    else {
      local_60._type = OT_INTEGER;
      local_60._unVal.pTable = local_40;
      local_40 = (SQTable *)
                 ((long)&(local_40->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                         _vptr_SQRefCounted + 1);
    }
    ::SQObjectPtr::SQObjectPtr(&local_80,(SQObject *)&stack0xffffffffffffffb0);
    ::SQObjectPtr::SQObjectPtr(&local_90,&local_60);
    SQTable::NewSlot((SQTable *)in_stack_ffffffffffffff48,
                     (SQObjectPtr *)in_stack_ffffffffffffff40.pTable,in_stack_ffffffffffffff38);
    ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff10);
    ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff10);
    if (*in_RDI == 0x2c) {
      Lex(in_stack_ffffffffffffff10);
    }
  }
  this_00 = *(SQCompiler **)(*(long *)(in_RDI[0x58] + 0x118) + 0x70);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffff48,&local_18);
  ::SQObjectPtr::SQObjectPtr
            ((SQObjectPtr *)&stack0xffffffffffffff38,(SQObjectPtr *)&stack0xffffffffffffff48);
  ::SQObjectPtr::SQObjectPtr(&local_d8,&local_38);
  SQTable::NewSlot((SQTable *)in_stack_ffffffffffffff48,
                   (SQObjectPtr *)in_stack_ffffffffffffff40.pTable,in_stack_ffffffffffffff38);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)this_00);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)this_00);
  ::SQObjectPtr::Null((SQObjectPtr *)this_00);
  Lex(this_00);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)this_00);
  return;
}

Assistant:

void EnumStatement()
    {
        Lex();
        SQObject id = Expect(TK_IDENTIFIER);
        Expect(_SC('{'));

        SQObject table = _fs->CreateTable();
        SQInteger nval = 0;
        while(_token != _SC('}')) {
            SQObject key = Expect(TK_IDENTIFIER);
            SQObject val;
            if(_token == _SC('=')) {
                Lex();
                val = ExpectScalar();
            }
            else {
                val._type = OT_INTEGER;
                val._unVal.nInteger = nval++;
            }
            _table(table)->NewSlot(SQObjectPtr(key),SQObjectPtr(val));
            if(_token == ',') Lex();
        }
        SQTable *enums = _table(_ss(_vm)->_consts);
        SQObjectPtr strongid = id;
        enums->NewSlot(SQObjectPtr(strongid),SQObjectPtr(table));
        strongid.Null();
        Lex();
    }